

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O0

uint fixup(wb_tree *tree,wb_node *n)

{
  wb_node *pwVar1;
  wb_node *pwVar2;
  wb_node *pwVar3;
  wb_node *pwVar4;
  uint32_t local_10c;
  uint32_t local_104;
  uint32_t local_fc;
  uint32_t local_f4;
  wb_tree *local_f0;
  wb_tree *local_e8;
  uint32_t local_d4;
  uint32_t local_cc;
  uint32_t local_c8;
  uint32_t local_c4;
  uint32_t local_bc;
  uint32_t local_b4;
  uint32_t local_ac;
  wb_tree *local_a8;
  wb_tree *local_a0;
  uint32_t local_8c;
  uint32_t local_84;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  wb_node *b_1;
  wb_node *a_1;
  wb_node *p_1;
  wb_node *nlr;
  wb_node *nl;
  wb_node *b;
  wb_node *a;
  wb_node *p;
  wb_node *nrl;
  wb_node *nr;
  uint weight;
  uint rotations;
  wb_node *n_local;
  wb_tree *tree_local;
  
  nr._4_4_ = 0;
  if (n->llink == (wb_node *)0x0) {
    local_74 = 1;
  }
  else {
    local_74 = n->llink->weight;
  }
  if (local_74 * 1000 < n->weight * 0x125) {
    pwVar1 = n->rlink;
    if (pwVar1 == (wb_node *)0x0) {
      fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0xa5,"fixup","nr != NULL");
      abort();
    }
    pwVar2 = pwVar1->llink;
    if (pwVar2 == (wb_node *)0x0) {
      local_78 = 1;
    }
    else {
      local_78 = pwVar2->weight;
    }
    if (local_78 * 1000 < pwVar1->weight * 0x24a) {
      tree_node_rot_left(tree,n);
      if (n->llink == (wb_node *)0x0) {
        local_7c = 1;
      }
      else {
        local_7c = n->llink->weight;
      }
      if (n->rlink == (wb_node *)0x0) {
        local_84 = 1;
      }
      else {
        local_84 = n->rlink->weight;
      }
      n->weight = local_7c + local_84;
      if (pwVar1->rlink == (wb_node *)0x0) {
        local_8c = 1;
      }
      else {
        local_8c = pwVar1->rlink->weight;
      }
      pwVar1->weight = local_7c + local_84 + local_8c;
      nr._4_4_ = 1;
    }
    else {
      if (pwVar2 == (wb_node *)0x0) {
        fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                ,0xaf,"fixup","nrl != NULL");
        abort();
      }
      pwVar3 = n->parent;
      pwVar2->parent = pwVar3;
      local_a8 = tree;
      if (pwVar3 != (wb_node *)0x0) {
        if (pwVar3->llink == n) {
          local_a0 = (wb_tree *)&pwVar3->llink;
        }
        else {
          local_a0 = (wb_tree *)&pwVar3->rlink;
        }
        local_a8 = local_a0;
      }
      local_a8->root = pwVar2;
      pwVar3 = pwVar2->llink;
      pwVar2->llink = n;
      n->parent = pwVar2;
      n->rlink = pwVar3;
      if (pwVar3 != (wb_node *)0x0) {
        pwVar3->parent = n;
      }
      pwVar4 = pwVar2->rlink;
      pwVar2->rlink = pwVar1;
      pwVar1->parent = pwVar2;
      pwVar1->llink = pwVar4;
      if (pwVar4 != (wb_node *)0x0) {
        pwVar4->parent = pwVar1;
      }
      if (n->llink == (wb_node *)0x0) {
        local_ac = 1;
      }
      else {
        local_ac = n->llink->weight;
      }
      if (pwVar3 == (wb_node *)0x0) {
        local_b4 = 1;
      }
      else {
        local_b4 = pwVar3->weight;
      }
      n->weight = local_ac + local_b4;
      if (pwVar4 == (wb_node *)0x0) {
        local_bc = 1;
      }
      else {
        local_bc = pwVar4->weight;
      }
      if (pwVar1->rlink == (wb_node *)0x0) {
        local_c4 = 1;
      }
      else {
        local_c4 = pwVar1->rlink->weight;
      }
      pwVar1->weight = local_bc + local_c4;
      pwVar2->weight = local_ac + local_b4 + local_bc + local_c4;
      nr._4_4_ = 2;
    }
  }
  else if (n->weight * 0x2c3 < local_74 * 1000) {
    pwVar1 = n->llink;
    if (pwVar1 == (wb_node *)0x0) {
      fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0xc6,"fixup","nl != NULL");
      abort();
    }
    if (pwVar1->llink == (wb_node *)0x0) {
      local_c8 = 1;
    }
    else {
      local_c8 = pwVar1->llink->weight;
    }
    if (pwVar1->weight * 0x19e < local_c8 * 1000) {
      tree_node_rot_right(tree,n);
      if (n->llink == (wb_node *)0x0) {
        local_cc = 1;
      }
      else {
        local_cc = n->llink->weight;
      }
      if (n->rlink == (wb_node *)0x0) {
        local_d4 = 1;
      }
      else {
        local_d4 = n->rlink->weight;
      }
      n->weight = local_cc + local_d4;
      pwVar1->weight = local_c8 + n->weight;
      nr._4_4_ = 1;
    }
    else {
      pwVar2 = pwVar1->rlink;
      if (pwVar2 == (wb_node *)0x0) {
        fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                ,0xd1,"fixup","nlr != NULL");
        abort();
      }
      pwVar3 = n->parent;
      pwVar2->parent = pwVar3;
      local_f0 = tree;
      if (pwVar3 != (wb_node *)0x0) {
        if (pwVar3->llink == n) {
          local_e8 = (wb_tree *)&pwVar3->llink;
        }
        else {
          local_e8 = (wb_tree *)&pwVar3->rlink;
        }
        local_f0 = local_e8;
      }
      local_f0->root = pwVar2;
      pwVar3 = pwVar2->llink;
      pwVar2->llink = pwVar1;
      pwVar1->parent = pwVar2;
      pwVar1->rlink = pwVar3;
      if (pwVar3 != (wb_node *)0x0) {
        pwVar3->parent = pwVar1;
      }
      pwVar4 = pwVar2->rlink;
      pwVar2->rlink = n;
      n->parent = pwVar2;
      n->llink = pwVar4;
      if (pwVar4 == (wb_node *)0x0) {
        local_f4 = 1;
      }
      else {
        pwVar4->parent = n;
        local_f4 = pwVar4->weight;
      }
      if (n->rlink == (wb_node *)0x0) {
        local_fc = 1;
      }
      else {
        local_fc = n->rlink->weight;
      }
      n->weight = local_f4 + local_fc;
      if (pwVar1->llink == (wb_node *)0x0) {
        local_104 = 1;
      }
      else {
        local_104 = pwVar1->llink->weight;
      }
      if (pwVar3 == (wb_node *)0x0) {
        local_10c = 1;
      }
      else {
        local_10c = pwVar3->weight;
      }
      pwVar1->weight = local_104 + local_10c;
      pwVar2->weight = local_f4 + local_fc + local_104 + local_10c;
      nr._4_4_ = 2;
    }
  }
  return nr._4_4_;
}

Assistant:

static inline unsigned
fixup(wb_tree* tree, wb_node* n)
{
    unsigned rotations = 0;
    unsigned weight = WEIGHT(n->llink);
    if (weight * 1000U < n->weight * 293U) {
	wb_node* nr = n->rlink;
	ASSERT(nr != NULL);
	wb_node* nrl = nr->llink;
	if (WEIGHT(nrl) * 1000U < nr->weight * 586U) {	/* LL */
	    /* Rotate |n| left. */
	    tree_node_rot_left(tree, n);
	    nr->weight = (n->weight = WEIGHT(n->llink) + WEIGHT(n->rlink)) +
			 WEIGHT(nr->rlink);
	    rotations += 1;
	} else {					/* RL */
	    /* Rotate |nr| right, then |n| left. */
	    ASSERT(nrl != NULL);
	    wb_node* const p = n->parent;
	    nrl->parent = p;
	    *(p ? (p->llink == n ? &p->llink : &p->rlink) : &tree->root) = nrl;

	    wb_node* const a = nrl->llink;
	    nrl->llink = n;
	    n->parent = nrl;
	    if ((n->rlink = a) != NULL)
		a->parent = n;

	    wb_node* const b = nrl->rlink;
	    nrl->rlink = nr;
	    nr->parent = nrl;
	    if ((nr->llink = b) != NULL)
		b->parent = nr;

	    nrl->weight = (n->weight = WEIGHT(n->llink) + WEIGHT(a)) +
			  (nr->weight = WEIGHT(b) + WEIGHT(nr->rlink));
	    rotations += 2;
	}
    } else if (weight * 1000U > n->weight * 707U) {
	wb_node* nl = n->llink;
	ASSERT(nl != NULL);
	weight = WEIGHT(nl->llink);
	if (weight * 1000U > nl->weight * 414U) {	/* RR */
	    tree_node_rot_right(tree, n);

	    n->weight = WEIGHT(n->llink) + WEIGHT(n->rlink);
	    nl->weight = weight + n->weight;
	    rotations += 1;
	} else {					/* LR */
	    /* Rotate |nl| left, then |n| right. */
	    wb_node* nlr = nl->rlink;
	    ASSERT(nlr != NULL);
	    wb_node* const p = n->parent;
	    nlr->parent = p;
	    *(p ? (p->llink == n ? &p->llink : &p->rlink) : &tree->root) = nlr;

	    wb_node* const a = nlr->llink;
	    nlr->llink = nl;
	    nl->parent = nlr;
	    if ((nl->rlink = a) != NULL)
		a->parent = nl;

	    wb_node* const b = nlr->rlink;
	    nlr->rlink = n;
	    n->parent = nlr;
	    if ((n->llink = b) != NULL)
		b->parent = n;

	    nlr->weight = (n->weight = WEIGHT(b) + WEIGHT(n->rlink)) +
			  (nl->weight = WEIGHT(nl->llink) + WEIGHT(a));
	    rotations += 2;
	}
    }
    return rotations;
}